

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void trial::protocol::serialization::
     save_overloader<trial::protocol::bintoken::oarchive,_std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_void>
     ::save(oarchive *ar,
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *data,uint protocol_version)

{
  writer *self;
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  string_view_type local_38;
  
  self = &ar->writer;
  bintoken::basic_writer<16UL>::
  overloader<trial::protocol::bintoken::token::begin_assoc_array,_void>::value(self);
  cVar1 = (**(code **)(*(long *)&(ar->writer).encoder.storage + 0x10))(self,1);
  if (cVar1 != '\0') {
    (**(code **)(*(long *)&(self->encoder).storage + 0x18))(self,0x82);
  }
  for (p_Var2 = (data->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(data->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    boost::archive::detail::basic_oarchive::end_preamble();
    bintoken::basic_writer<16UL>::overloader<int,_void>::value(self,p_Var2[1]._M_color);
    local_38._M_str = (char *)p_Var2[1]._M_parent;
    local_38._M_len = (size_t)p_Var2[1]._M_left;
    bintoken::detail::basic_encoder<16UL>::value(&self->encoder,&local_38);
  }
  bintoken::basic_writer<16UL>::overloader<trial::protocol::bintoken::token::end_assoc_array,_void>
  ::value(self);
  return;
}

Assistant:

static void save(protocol::bintoken::oarchive& ar,
                     const std::map<Key, T, Compare, Allocator>& data,
                     const unsigned int protocol_version)
    {
        ar.save<bintoken::token::begin_assoc_array>();
        ar.save<bintoken::token::null>();
        for (typename std::map<Key, T, Compare, Allocator>::const_iterator it = data.begin();
             it != data.end();
             ++it)
        {
            ar.save_override(it->first, protocol_version);
            ar.save_override(it->second, protocol_version);
        }
        ar.save<bintoken::token::end_assoc_array>();
    }